

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_Internal_ExtrudedVertex::UndoAttachUnmarkedFacesToCopiedVertex(ON_Internal_ExtrudedVertex *this)

{
  ON_SubDFace *pOVar1;
  ON_SubDFace *f;
  unsigned_short vfi;
  ON_Internal_ExtrudedVertex *this_local;
  
  if (((this->m_copied_vertex != (ON_SubDVertex *)0x0) && (this->m_copied_vertex->m_face_count != 0)
      ) && (this->m_original_vertex != (ON_SubDVertex *)0x0)) {
    for (f._6_2_ = 0; f._6_2_ < this->m_copied_vertex->m_face_count; f._6_2_ = f._6_2_ + 1) {
      pOVar1 = this->m_copied_vertex->m_faces[f._6_2_];
      if ((pOVar1 != (ON_SubDFace *)0x0) &&
         (this->m_copied_vertex->m_faces[f._6_2_] = (ON_SubDFace *)0x0,
         this->m_original_vertex->m_face_count < this->m_original_vertex->m_face_capacity)) {
        this->m_original_vertex->m_faces[this->m_original_vertex->m_face_count] = pOVar1;
        this->m_original_vertex->m_face_count = this->m_original_vertex->m_face_count + 1;
      }
    }
    this->m_copied_vertex->m_face_count = 0;
  }
  return;
}

Assistant:

void UndoAttachUnmarkedFacesToCopiedVertex()
  {
    // This is used to resort the subd to a somewhat valid state after a critical error occurs
    if (nullptr == m_copied_vertex)
      return;
    if (0 == m_copied_vertex->m_face_count)
      return;
    if (nullptr == m_original_vertex)
      return;
    // Move faces from m_copied_vertex back to m_original_vertex (which is where they started).
    for (unsigned short vfi = 0; vfi < m_copied_vertex->m_face_count; vfi++)
    {
      const ON_SubDFace* f = m_copied_vertex->m_faces[vfi];
      if (nullptr == f)
        continue;
      m_copied_vertex->m_faces[vfi] = nullptr;
      if (m_original_vertex->m_face_count < m_original_vertex->m_face_capacity)
      {
        m_original_vertex->m_faces[m_original_vertex->m_face_count] = f;
        m_original_vertex->m_face_count++;
      }
    }
    m_copied_vertex->m_face_count = 0;
  }